

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_send_text(telnet_t *telnet,char *buffer,size_t size)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  char local_5a [2];
  telnet_event_t local_58;
  
  if (size == 0) {
    size = 0;
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    sVar3 = 0;
    do {
      cVar1 = buffer[sVar3];
      if (cVar1 == -1) {
        local_58.error.func = (char *)(sVar3 - lVar2);
        if ((char *)local_58.data.size != (char *)0x0) {
          local_58.data.buffer = buffer + lVar2;
          local_58.type = TELNET_EV_SEND;
          (*telnet->eh)(telnet,&local_58,telnet->ud);
        }
        local_5a[0] = -1;
        local_5a[1] = -1;
        local_58.data.buffer = local_5a;
LAB_001030e8:
        local_58.type = TELNET_EV_SEND;
        lVar2 = sVar3 + 1;
        local_58.data.size = 2;
        (*telnet->eh)(telnet,&local_58,telnet->ud);
      }
      else if (((telnet->flags & 0x20) == 0) && ((cVar1 == '\r' || (cVar1 == '\n')))) {
        local_58.error.func = (char *)(sVar3 - lVar2);
        if ((char *)local_58.data.size != (char *)0x0) {
          local_58.data.buffer = buffer + lVar2;
          local_58.type = TELNET_EV_SEND;
          (*telnet->eh)(telnet,&local_58,telnet->ud);
        }
        if (buffer[sVar3] == '\r') {
          local_58.data.buffer = "\r";
        }
        else {
          local_58.data.buffer = "\r\n";
        }
        goto LAB_001030e8;
      }
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  local_58.error.func = (char *)(size - lVar2);
  if ((char *)local_58.data.size != (char *)0x0) {
    local_58.data.buffer = buffer + lVar2;
    local_58.type = TELNET_EV_SEND;
    (*telnet->eh)(telnet,&local_58,telnet->ud);
  }
  return;
}

Assistant:

void telnet_send_text(telnet_t *telnet, const char *buffer,
		size_t size) {
	size_t i, l;

	for (l = i = 0; i != size; ++i) {
		/* dump prior portion of text, send escaped bytes */
		if (buffer[i] == (char)TELNET_IAC) {
			/* dump prior text if any */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* send escape */
			telnet_iac(telnet, TELNET_IAC);
		}
		/* special characters if not in BINARY mode */
		else if (!(telnet->flags & TELNET_FLAG_TRANSMIT_BINARY) &&
				 (buffer[i] == '\r' || buffer[i] == '\n')) {
			/* dump prior portion of text */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* automatic translation of \r -> CRNUL */
			if (buffer[i] == '\r') {
				_send(telnet, CRNUL, 2);
			}
			/* automatic translation of \n -> CRLF */
			else {
				_send(telnet, CRLF, 2);
			}
		}
	}

	/* send whatever portion of buffer is left */
	if (i != l) {
		_send(telnet, buffer + l, i - l);
	}
}